

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::token_matcher<json_out_callbacks,_pstore::json::details::true_complete>::
consume(pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
        *__return_storage_ptr__,
       token_matcher<json_out_callbacks,_pstore::json::details::true_complete> *this,
       parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  error_category *peVar7;
  bool bVar8;
  error_code err;
  char *local_28;
  bool bVar9;
  
  iVar3 = (this->super_matcher<json_out_callbacks>).state_;
  if (iVar3 == 2) {
    if (ch->valid_ == true) {
      pcVar6 = maybe<char,_void>::operator->(ch);
      pcVar4 = this->text_;
      if (*pcVar6 == *pcVar4) {
        this->text_ = pcVar4 + 1;
        bVar8 = true;
        if (pcVar4[1] != '\0') goto LAB_00137305;
        iVar3 = 3;
        bVar9 = true;
        goto LAB_00137301;
      }
    }
LAB_001372e0:
    peVar7 = get_error_category();
    err._M_cat = peVar7;
    err._0_8_ = 0xb;
    bVar2 = parser<json_out_callbacks>::set_error(parser,err);
    bVar8 = true;
    iVar3 = 1;
    bVar9 = true;
    if (!bVar2) goto LAB_00137305;
  }
  else {
    bVar9 = true;
    bVar8 = true;
    if (iVar3 != 3) {
      if (iVar3 == 1) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x1ad);
      }
      goto LAB_00137305;
    }
    if (ch->valid_ == true) {
      pcVar4 = maybe<char,_void>::operator->(ch);
      iVar3 = isalnum((int)*pcVar4);
      if (iVar3 != 0) goto LAB_001372e0;
      bVar9 = false;
    }
    local_28 = "true";
    json_out_callbacks::append<char_const*>(&parser->callbacks_,&local_28);
    uVar5 = std::_V2::system_category();
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    parser<json_out_callbacks>::set_error(parser,(error_code)(auVar1 << 0x40));
    iVar3 = 1;
  }
LAB_00137301:
  bVar8 = bVar9;
  (this->super_matcher<json_out_callbacks>).state_ = iVar3;
LAB_00137305:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       (matcher<json_out_callbacks> *)0x0;
  __return_storage_ptr__->second = bVar8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }